

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O0

AttributeSpec *
deqp::gls::DrawTestSpec::AttributeSpec::createAttributeArray
          (AttributeSpec *__return_storage_ptr__,InputType inputType,OutputType outputType,
          Storage storage,Usage usage,int componentCount,int offset,int stride,bool normalize,
          int instanceDivisor)

{
  AttributeSpec *spec;
  bool normalize_local;
  int componentCount_local;
  Usage usage_local;
  Storage storage_local;
  OutputType outputType_local;
  InputType inputType_local;
  
  AttributeSpec(__return_storage_ptr__);
  __return_storage_ptr__->inputType = inputType;
  __return_storage_ptr__->outputType = outputType;
  __return_storage_ptr__->storage = storage;
  __return_storage_ptr__->usage = usage;
  __return_storage_ptr__->componentCount = componentCount;
  __return_storage_ptr__->offset = offset;
  __return_storage_ptr__->stride = stride;
  __return_storage_ptr__->normalize = normalize;
  __return_storage_ptr__->instanceDivisor = instanceDivisor;
  __return_storage_ptr__->useDefaultAttribute = false;
  return __return_storage_ptr__;
}

Assistant:

DrawTestSpec::AttributeSpec	DrawTestSpec::AttributeSpec::createAttributeArray (InputType inputType, OutputType outputType, Storage storage, Usage usage, int componentCount, int offset, int stride, bool normalize, int instanceDivisor)
{
	DrawTestSpec::AttributeSpec spec;

	spec.inputType			= inputType;
	spec.outputType			= outputType;
	spec.storage			= storage;
	spec.usage				= usage;
	spec.componentCount		= componentCount;
	spec.offset				= offset;
	spec.stride				= stride;
	spec.normalize			= normalize;
	spec.instanceDivisor	= instanceDivisor;

	spec.useDefaultAttribute= false;

	return spec;
}